

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_triangle_from_direction
               (nk_vec2 *result,nk_rect r,float pad_x,float pad_y,nk_heading direction)

{
  int in_ESI;
  nk_vec2 *in_RDI;
  undefined8 in_XMM0_Qa;
  nk_vec2 nVar1;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float h_half;
  float w_half;
  float local_94;
  float local_90;
  float local_10;
  float fStack_c;
  
  local_90 = in_XMM1_Da;
  if (in_XMM1_Da <= in_XMM2_Da * 2.0) {
    local_90 = in_XMM2_Da * 2.0;
  }
  local_94 = in_XMM1_Db;
  if (in_XMM1_Db <= in_XMM3_Da * 2.0) {
    local_94 = in_XMM3_Da * 2.0;
  }
  local_90 = local_90 - (in_XMM2_Da + in_XMM2_Da);
  local_94 = local_94 - (in_XMM3_Da + in_XMM3_Da);
  local_10 = (float)in_XMM0_Qa;
  local_10 = local_10 + in_XMM2_Da;
  fStack_c = (float)((ulong)in_XMM0_Qa >> 0x20);
  fStack_c = fStack_c + in_XMM3_Da;
  if (in_ESI == 0) {
    nVar1 = nk_vec2(local_10 + local_90 / 2.0,fStack_c);
    *in_RDI = nVar1;
    nVar1 = nk_vec2(local_10 + local_90,fStack_c + local_94);
    in_RDI[1] = nVar1;
    nVar1 = nk_vec2(local_10,fStack_c + local_94);
    in_RDI[2] = nVar1;
  }
  else if (in_ESI == 1) {
    nVar1 = nk_vec2(local_10,fStack_c);
    *in_RDI = nVar1;
    nVar1 = nk_vec2(local_10 + local_90,fStack_c + local_94 / 2.0);
    in_RDI[1] = nVar1;
    nVar1 = nk_vec2(local_10,fStack_c + local_94);
    in_RDI[2] = nVar1;
  }
  else if (in_ESI == 2) {
    nVar1 = nk_vec2(local_10,fStack_c);
    *in_RDI = nVar1;
    nVar1 = nk_vec2(local_10 + local_90,fStack_c);
    in_RDI[1] = nVar1;
    nVar1 = nk_vec2(local_10 + local_90 / 2.0,fStack_c + local_94);
    in_RDI[2] = nVar1;
  }
  else {
    nVar1 = nk_vec2(local_10,fStack_c + local_94 / 2.0);
    *in_RDI = nVar1;
    nVar1 = nk_vec2(local_10 + local_90,fStack_c);
    in_RDI[1] = nVar1;
    nVar1 = nk_vec2(local_10 + local_90,fStack_c + local_94);
    in_RDI[2] = nVar1;
  }
  return;
}

Assistant:

NK_API void
nk_triangle_from_direction(struct nk_vec2 *result, struct nk_rect r,
float pad_x, float pad_y, enum nk_heading direction)
{
float w_half, h_half;
NK_ASSERT(result);

r.w = NK_MAX(2 * pad_x, r.w);
r.h = NK_MAX(2 * pad_y, r.h);
r.w = r.w - 2 * pad_x;
r.h = r.h - 2 * pad_y;

r.x = r.x + pad_x;
r.y = r.y + pad_y;

w_half = r.w / 2.0f;
h_half = r.h / 2.0f;

if (direction == NK_UP) {
result[0] = nk_vec2(r.x + w_half, r.y);
result[1] = nk_vec2(r.x + r.w, r.y + r.h);
result[2] = nk_vec2(r.x, r.y + r.h);
} else if (direction == NK_RIGHT) {
result[0] = nk_vec2(r.x, r.y);
result[1] = nk_vec2(r.x + r.w, r.y + h_half);
result[2] = nk_vec2(r.x, r.y + r.h);
} else if (direction == NK_DOWN) {
result[0] = nk_vec2(r.x, r.y);
result[1] = nk_vec2(r.x + r.w, r.y);
result[2] = nk_vec2(r.x + w_half, r.y + r.h);
} else {
result[0] = nk_vec2(r.x, r.y + h_half);
result[1] = nk_vec2(r.x + r.w, r.y);
result[2] = nk_vec2(r.x + r.w, r.y + r.h);
}
}